

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  snd_pcm_state_t sVar1;
  int iVar2;
  pthread_t __thread1;
  long errorCode;
  char *errorText;
  void *local_68;
  int local_58;
  int local_54;
  int xrun;
  int __pa_unsure_error_id;
  snd_pcm_t *save;
  void *userBuffer;
  unsigned_long framesAvail;
  unsigned_long framesGot;
  PaAlsaStream *stream;
  void *pvStack_20;
  PaError result;
  unsigned_long frames_local;
  void *buffer_local;
  PaStream *s_local;
  
  stream._4_4_ = 0;
  _xrun = *(undefined8 *)((long)s + 0x340);
  framesGot = (unsigned_long)s;
  pvStack_20 = (void *)frames;
  frames_local = (unsigned_long)buffer;
  buffer_local = s;
  if (s == (PaStream *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1121,"PaError ReadStream(PaStream *, void *, unsigned long)");
  }
  if (*(long *)((long)s + 0x2c0) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4387\n"
                     );
    stream._4_4_ = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      stream._4_4_ = -0x26fd;
      *(undefined8 *)((long)s + 0x280) = 0;
    }
    save = (snd_pcm_t *)buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      save = *(snd_pcm_t **)((long)s + 0x2e8);
      memcpy(save,buffer,(long)*(int *)((long)s + 0x290) << 3);
    }
    sVar1 = (*alsa_snd_pcm_state)(*(snd_pcm_t **)(framesGot + 0x2c0));
    if ((sVar1 == SND_PCM_STATE_PREPARED) &&
       (local_54 = (*(code *)alsa_snd_pcm_start)(*(undefined8 *)(framesGot + 0x2c0)), local_54 < 0))
    {
      __thread1 = pthread_self();
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar2 != 0) {
        errorCode = (long)local_54;
        errorText = (*alsa_snd_strerror)(local_54);
        PaUtil_SetLastHostErrorInfo(paALSA,errorCode,errorText);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4412\n"
                       );
      stream._4_4_ = -9999;
    }
    else {
      while (pvStack_20 != (void *)0x0) {
        local_58 = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames
                               ((PaAlsaStream *)framesGot,(unsigned_long *)&userBuffer,&local_58);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4418\n"
                           );
          stream._4_4_ = paUtilErr_;
          break;
        }
        if (userBuffer < pvStack_20) {
          local_68 = userBuffer;
        }
        else {
          local_68 = pvStack_20;
        }
        framesAvail = (unsigned_long)local_68;
        paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)framesGot,&framesAvail,&local_58);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4421\n"
                           );
          stream._4_4_ = paUtilErr_;
          break;
        }
        if (framesAvail != 0) {
          framesAvail = PaUtil_CopyInput((PaUtilBufferProcessor *)(framesGot + 0x68),&save,
                                         framesAvail);
          paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)framesGot,framesAvail,&local_58);
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4425\n"
                             );
            stream._4_4_ = paUtilErr_;
            break;
          }
          pvStack_20 = (void *)((long)pvStack_20 - framesAvail);
        }
      }
    }
  }
  *(undefined8 *)(framesGot + 0x340) = _xrun;
  return stream._4_4_;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}